

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

int space_mixer_mix(mixed_segment *segment)

{
  float fVar1;
  byte bVar2;
  long *plVar3;
  mixed_buffer *pmVar4;
  undefined8 *puVar5;
  void *__s;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  uint32_t uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  undefined8 uStack_60;
  float *local_58;
  float local_4c;
  float *local_48;
  float *in;
  uint32_t local_34 [2];
  uint32_t samples;
  
  local_58 = (float *)&local_58;
  plVar3 = (long *)segment->data;
  local_34[0] = 0xffffffff;
  bVar2 = *(byte *)((long)plVar3 + 0x542c);
  lVar7 = -(ulong)((uint)bVar2 * 8 + 0xf & 0xfffffff0);
  lVar8 = lVar7 + -0x58;
  local_4c = *(float *)(plVar3 + 0xaa1);
  in = (float *)(ulong)bVar2;
  if (bVar2 != 0) {
    uVar15 = 0;
    do {
      pmVar4 = *(mixed_buffer **)(plVar3[2] + uVar15);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x14409a;
      mixed_buffer_request_write
                ((float **)((long)&local_58 + uVar15 + lVar8 + 0x58),local_34,pmVar4);
      uVar15 = uVar15 + 8;
    } while ((uint)bVar2 * 8 != uVar15);
  }
  pfVar9 = in;
  uVar12 = *(uint *)(plVar3 + 1);
  if (uVar12 == 0) {
    uVar12 = 0;
  }
  else {
    uVar15 = 0;
    do {
      puVar5 = *(undefined8 **)(*plVar3 + uVar15 * 8);
      if (puVar5 != (undefined8 *)0x0) {
        pmVar4 = (mixed_buffer *)*puVar5;
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1440d0;
        mixed_buffer_request_read(&local_48,local_34,pmVar4);
        if (local_34[0] == 0) goto LAB_00144226;
        uVar12 = *(uint *)(plVar3 + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar12);
  }
  if (local_34[0] != 0) {
    if (pfVar9 != (float *)0x0) {
      pfVar16 = (float *)0x0;
      do {
        __s = *(void **)((long)&local_58 + (long)pfVar16 * 8 + lVar8 + 0x58);
        uVar15 = (ulong)local_34[0];
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x144113;
        memset(__s,0,uVar15 << 2);
        pfVar16 = (float *)((long)pfVar16 + 1);
      } while (pfVar9 != pfVar16);
      uVar12 = *(uint *)(plVar3 + 1);
    }
    if (uVar12 != 0) {
      in = (float *)(plVar3 + 0xa8a);
      uVar15 = 0;
      do {
        puVar5 = *(undefined8 **)(*plVar3 + uVar15 * 8);
        if (puVar5 != (undefined8 *)0x0) {
          if (*(char *)(puVar5 + 0x1b) == '\x01') {
            *(undefined8 *)((long)&uStack_60 + lVar7) = 0x144159;
            calculate_volumes_resolver(puVar5,plVar3);
            *(undefined8 *)((long)&uStack_60 + lVar7) = 0x144164;
            calculate_pitch_shift_resolver(puVar5,plVar3);
            *(undefined1 *)(puVar5 + 0x1b) = 0;
          }
          pmVar4 = (mixed_buffer *)*puVar5;
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x14417d;
          mixed_buffer_request_read(&local_48,local_34,pmVar4);
          uVar11 = local_34[0];
          pfVar10 = in;
          pfVar16 = local_48;
          if ((*(float *)((long)puVar5 + 0xd4) != 1.0) || (NAN(*(float *)((long)puVar5 + 0xd4)))) {
            *(undefined8 *)((long)&uStack_60 + lVar7) = 0x1441b3;
            fft_window_resolver(pfVar16,pfVar16,uVar11,pfVar10,fft_pitch_shift_resolver,
                                (long)puVar5 + 0xd4);
          }
          uVar11 = local_34[0];
          bVar2 = *(byte *)((long)puVar5 + 0xd1);
          if ((ulong)bVar2 != 0) {
            uVar13 = 0;
            do {
              if ((ulong)local_34[0] != 0) {
                lVar6 = *(long *)((long)&local_58 +
                                 (ulong)*(byte *)((long)puVar5 + uVar13 + 0xb0) * 8 + lVar8 + 0x58);
                fVar1 = *(float *)((long)puVar5 + uVar13 * 4 + 0x2c);
                uVar14 = 0;
                do {
                  *(float *)(lVar6 + uVar14 * 4) =
                       local_4c * fVar1 * local_48[uVar14] + *(float *)(lVar6 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (local_34[0] != uVar14);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != bVar2);
          }
          pmVar4 = (mixed_buffer *)*puVar5;
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x144215;
          mixed_buffer_finish_read(uVar11,pmVar4);
          uVar12 = *(uint *)(plVar3 + 1);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar12);
    }
  }
LAB_00144226:
  if (pfVar9 != (float *)0x0) {
    pfVar16 = (float *)0x0;
    do {
      uVar11 = local_34[0];
      pmVar4 = *(mixed_buffer **)(plVar3[2] + (long)pfVar16 * 8);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x14423e;
      mixed_buffer_finish_write(uVar11,pmVar4);
      pfVar16 = (float *)((long)pfVar16 + 1);
    } while (pfVar9 != pfVar16);
  }
  return 1;
}

Assistant:

VECTORIZE int space_mixer_mix(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  uint32_t samples = UINT32_MAX;
  uint32_t channels = data->channels.count;
  float *restrict outs[channels], *restrict in;
  float global_volume = data->volume;
  
  // Compute sample counts
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_request_write(&outs[c], &samples, data->out[c]);
  }
  for(uint32_t s=0; s<data->count; ++s){
    struct space_source *source = data->sources[s];
    if(!source) continue;

    mixed_buffer_request_read(&in, &samples, source->buffer);
    if(samples == 0) break;
  }

  if(0 < samples){
    for(mixed_channel_t c=0; c<channels; ++c){
      memset(outs[c], 0, samples*sizeof(float));
    }
    for(uint32_t s=0; s<data->count; ++s){
      struct space_source *source = data->sources[s];
      if(!source) continue;
      
      if(source->dirty){
        calculate_volumes(source, data);
        calculate_pitch_shift(source, data);
        source->dirty = 0;
      }

      mixed_buffer_request_read(&in, &samples, source->buffer);
      if(source->pitch != 1.0)
        fft_window(in, in, samples, &data->fft_window_data, fft_pitch_shift, &source->pitch);
      for(mixed_channel_t c=0; c<source->speaker_count; ++c){
        float *restrict out = outs[source->speakers[c]];
        float volume = global_volume*source->volumes[c];
        for(uint32_t i=0; i<samples; ++i){
          out[i] += volume * in[i];
        }
      }
      mixed_buffer_finish_read(samples, source->buffer);
    }
  }
  for(mixed_channel_t c=0; c<channels; ++c){
    mixed_buffer_finish_write(samples, data->out[c]);
  };
  return 1;
}